

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O0

bool DateTime::IsValidYearMonthDay(int year,int month,int day)

{
  bool bVar1;
  int iVar2;
  undefined1 local_15;
  bool valid;
  int day_local;
  int month_local;
  int year_local;
  
  local_15 = true;
  bVar1 = IsValidYearMonth(year,month);
  if (bVar1) {
    if ((day < 1) || (iVar2 = DaysInMonth(year,month), iVar2 < day)) {
      local_15 = false;
    }
  }
  else {
    local_15 = false;
  }
  return local_15;
}

Assistant:

static bool IsValidYearMonthDay(int year, int month, int day)
    {
        bool valid = true;
        if (IsValidYearMonth(year, month))
        {
            if (day < 1 || day > DaysInMonth(year, month))
            {
                valid = false;
            }
        }
        else
        {
            valid = false;
        }
        return valid;
    }